

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

bool crnd::crnd_get_data(crnd_unpack_context pContext,void **ppData,uint32 *pData_size)

{
  if ((pContext != (crnd_unpack_context)0x0) && (*pContext == 0x1ef9cabd)) {
    if (ppData != (void **)0x0) {
      *ppData = *(void **)((long)pContext + 8);
    }
    if (pData_size != (uint32 *)0x0) {
      *pData_size = *(uint32 *)((long)pContext + 0x10);
    }
    return true;
  }
  return false;
}

Assistant:

bool crnd_get_data(crnd_unpack_context pContext, const void** ppData, uint32* pData_size)
    {
        if (!pContext)
            return false;

        crn_unpacker* pUnpacker = static_cast<crn_unpacker*>(pContext);

        if (!pUnpacker->is_valid())
            return false;

        if (ppData)
            *ppData = pUnpacker->get_data();

        if (pData_size)
            *pData_size = pUnpacker->get_data_size();

        return true;
    }